

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void CHECK(int t,int st,int got,int expect,int pc,char *desc)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  undefined8 in_R9;
  
  if ((((100.0 - (double)in_R8D) * (double)(int)in_ECX) / 100.0 <= (double)(int)in_EDX) &&
     ((double)(int)in_EDX <= (((double)in_R8D + 100.0) * (double)(int)in_ECX) / 100.0)) {
    printf("TEST %2d.%-2d PASS (%s: %d)\n",(ulong)in_EDI,(ulong)in_ESI,in_R9,(ulong)in_ECX);
    return;
  }
  fprintf(_stderr,"TEST %2d.%-2d FAILED got %d (%s: %d)\n",(ulong)in_EDI,(ulong)in_ESI,(ulong)in_EDX
          ,in_R9);
  return;
}

Assistant:

void CHECK(int t, int st, int got, int expect, int pc, char *desc)
{
   if ((got >= (((1E2-pc)*expect)/1E2)) && (got <= (((1E2+pc)*expect)/1E2)))
   {
      printf("TEST %2d.%-2d PASS (%s: %d)\n", t, st, desc, expect);
   }
   else
   {
      fprintf(stderr,
              "TEST %2d.%-2d FAILED got %d (%s: %d)\n",
              t, st, got, desc, expect);
   }
}